

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Clara::CommandLine<Catch::ConfigData>::usage
          (CommandLine<Catch::ConfigData> *this,ostream *os,string *procName)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"usage:\n  ",9);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(procName->_M_dataplus)._M_p,procName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  argSynopsis(this,os);
  if ((this->m_options).
      super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_options).
      super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              (os," [options]\n\nwhere options are: \n",0x20);
    optUsage(this,os,2,0x50);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

void usage( std::ostream& os, std::string const& procName ) const {
            os << "usage:\n  " << procName << " ";
            argSynopsis( os );
            if( !m_options.empty() ) {
                os << " [options]\n\nwhere options are: \n";
                optUsage( os, 2 );
            }
            os << "\n";
        }